

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<unsigned_short>
               (char *label_id,unsigned_short *xs,unsigned_short *ys1,unsigned_short *ys2,int count,
               int offset,int stride)

{
  undefined1 local_70 [8];
  GetterXsYs<unsigned_short> getter2;
  GetterXsYs<unsigned_short> getter1;
  int offset_local;
  int count_local;
  unsigned_short *ys2_local;
  unsigned_short *ys1_local;
  unsigned_short *xs_local;
  char *label_id_local;
  
  GetterXsYs<unsigned_short>::GetterXsYs
            ((GetterXsYs<unsigned_short> *)&getter2.Stride,xs,ys1,count,offset,stride);
  GetterXsYs<unsigned_short>::GetterXsYs
            ((GetterXsYs<unsigned_short> *)local_70,xs,ys2,count,offset,stride);
  PlotShadedEx<ImPlot::GetterXsYs<unsigned_short>,ImPlot::GetterXsYs<unsigned_short>>
            (label_id,(GetterXsYs<unsigned_short> *)&getter2.Stride,
             (GetterXsYs<unsigned_short> *)local_70);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys1, const T* ys2, int count, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys1, count, offset, stride);
    GetterXsYs<T> getter2(xs, ys2, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}